

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split_internal.h
# Opt level: O3

pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
* __thiscall
absl::lts_20240722::strings_internal::
Splitter<absl::lts_20240722::ByChar,absl::lts_20240722::AllowEmpty,std::basic_string_view<char,std::char_traits<char>>>
::
ConvertToPair<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
          (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
           *__return_storage_ptr__,void *this)

{
  SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *pSVar1;
  string_view second;
  string_view first;
  const_iterator it;
  size_t local_68;
  char *pcStack_60;
  size_t local_58;
  char *pcStack_50;
  SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_48;
  
  local_58 = 0;
  pcStack_50 = (char *)0x0;
  local_68 = 0;
  pcStack_60 = (char *)0x0;
  SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::SplitIterator(&local_48,kInitState,
                  (Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   *)this);
  if ((local_48.state_ != kEndState) || (local_48.pos_ != *this)) {
    local_58 = local_48.curr_._M_len;
    pcStack_50 = local_48.curr_._M_str;
    pSVar1 = SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::operator++(&local_48);
    if ((pSVar1->state_ != kEndState) || (pSVar1->pos_ != *this)) {
      local_68 = local_48.curr_._M_len;
      pcStack_60 = local_48.curr_._M_str;
    }
  }
  (__return_storage_ptr__->first)._M_len = local_58;
  (__return_storage_ptr__->first)._M_str = pcStack_50;
  (__return_storage_ptr__->second)._M_len = local_68;
  (__return_storage_ptr__->second)._M_str = pcStack_60;
  return __return_storage_ptr__;
}

Assistant:

std::pair<First, Second> ConvertToPair() const {
    absl::string_view first, second;
    auto it = begin();
    if (it != end()) {
      first = *it;
      if (++it != end()) {
        second = *it;
      }
    }
    return {First(first), Second(second)};
  }